

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

index_t __thiscall
GEO::PeriodicDelaunay3d::get_periodic_vertex_instances_to_create
          (PeriodicDelaunay3d *this,index_t v,ConvexCell *C,bool *use_instance,
          bool *cell_is_on_boundary,bool *cell_is_outside_cube,IncidentTetrahedra *W)

{
  vec4 eqn;
  vec4 eqn_00;
  vec4 eqn_01;
  vec4 eqn_02;
  vec4 eqn_03;
  vec4 eqn_04;
  vec4 eqn_05;
  vec4 eqn_06;
  vec4 eqn_07;
  vec4 eqn_08;
  vec4 eqn_09;
  vec4 eqn_10;
  bool *pbVar1;
  bool bVar2;
  index_t iVar3;
  index_t iVar4;
  uint local_3b4;
  index_t local_3b0;
  index_t i_1;
  index_t result;
  int Tz;
  int Ty;
  int Tx;
  int dW;
  int dV;
  int dU;
  index_t pp;
  index_t lv;
  int iStack_384;
  bool vertex_on_boundary;
  int VXLAT [3] [3];
  ushort local_356;
  int local_354;
  int iStack_350;
  ushort t;
  int TZ;
  int TY;
  int TX;
  vecng<4U,_double> local_328;
  vecng<4U,_double> local_308;
  vecng<4U,_double> local_2e8;
  vecng<4U,_double> local_2c8;
  vecng<4U,_double> local_2a8;
  int local_284;
  int local_280;
  int TZmax;
  int TZmin;
  int TYmax;
  int TYmin;
  int TXmax;
  int TXmin;
  allocator local_241;
  string local_240 [32];
  vecng<4U,_double> local_220;
  vecng<4U,_double> local_200;
  vecng<4U,_double> local_1e0;
  vecng<4U,_double> local_1c0;
  vecng<4U,_double> local_1a0;
  vecng<4U,_double> local_180;
  vecng<4U,_double> local_160;
  vecng<4U,_double> local_140;
  vecng<4U,_double> local_120;
  vecng<4U,_double> local_100;
  vecng<4U,_double> local_e0;
  vecng<4U,_double> local_c0;
  index_t local_9c;
  uint local_98;
  index_t cube_offset;
  index_t i;
  allocator local_59;
  string local_58 [32];
  bool *local_38;
  bool *cell_is_outside_cube_local;
  bool *cell_is_on_boundary_local;
  bool *use_instance_local;
  ConvexCell *C_local;
  PeriodicDelaunay3d *pPStack_10;
  index_t v_local;
  PeriodicDelaunay3d *this_local;
  
  local_38 = cell_is_outside_cube;
  cell_is_outside_cube_local = cell_is_on_boundary;
  cell_is_on_boundary_local = use_instance;
  use_instance_local = (bool *)C;
  C_local._4_4_ = v;
  pPStack_10 = this;
  copy_Laguerre_cell_from_Delaunay(this,v,C,W);
  bVar2 = VBW::ConvexCell::empty((ConvexCell *)use_instance_local);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"!C.empty()",&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&i,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,(allocator *)((long)&cube_offset + 3));
    geo_assertion_failed((string *)local_58,(string *)&i,0x7b96);
  }
  for (local_98 = 0; local_98 < 0x1b; local_98 = local_98 + 1) {
    cell_is_on_boundary_local[local_98] = false;
  }
  *cell_is_on_boundary_local = true;
  local_9c = VBW::ConvexCell::nb_v((ConvexCell *)use_instance_local);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_c0,1.0,0.0,0.0,0.0);
  eqn.y = local_c0.y;
  eqn.x = local_c0.x;
  eqn.z = local_c0.z;
  eqn.w = local_c0.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_e0,-1.0,0.0,0.0,this->period_);
  eqn_00.y = local_e0.y;
  eqn_00.x = local_e0.x;
  eqn_00.z = local_e0.z;
  eqn_00.w = local_e0.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_00);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_100,0.0,1.0,0.0,0.0);
  eqn_01.y = local_100.y;
  eqn_01.x = local_100.x;
  eqn_01.z = local_100.z;
  eqn_01.w = local_100.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_01);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_120,0.0,-1.0,0.0,this->period_);
  eqn_02.y = local_120.y;
  eqn_02.x = local_120.x;
  eqn_02.z = local_120.z;
  eqn_02.w = local_120.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_02);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_140,0.0,0.0,1.0,0.0);
  eqn_03.y = local_140.y;
  eqn_03.x = local_140.x;
  eqn_03.z = local_140.z;
  eqn_03.w = local_140.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_03);
  pbVar1 = use_instance_local;
  vecng<4U,_double>::vecng(&local_160,0.0,0.0,-1.0,this->period_);
  eqn_04.y = local_160.y;
  eqn_04.x = local_160.x;
  eqn_04.z = local_160.z;
  eqn_04.w = local_160.w;
  VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_04);
  *local_38 = false;
  *cell_is_outside_cube_local = false;
  bVar2 = VBW::ConvexCell::empty((ConvexCell *)use_instance_local);
  if (bVar2) {
    *local_38 = true;
    copy_Laguerre_cell_from_Delaunay(this,C_local._4_4_,(ConvexCell *)use_instance_local,W);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_180,1.0,0.0,0.0,this->period_);
    eqn_05.y = local_180.y;
    eqn_05.x = local_180.x;
    eqn_05.z = local_180.z;
    eqn_05.w = local_180.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_05);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_1a0,-1.0,0.0,0.0,this->period_ * 2.0);
    eqn_06.y = local_1a0.y;
    eqn_06.x = local_1a0.x;
    eqn_06.z = local_1a0.z;
    eqn_06.w = local_1a0.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_06);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_1c0,0.0,1.0,0.0,this->period_);
    eqn_07.y = local_1c0.y;
    eqn_07.x = local_1c0.x;
    eqn_07.z = local_1c0.z;
    eqn_07.w = local_1c0.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_07);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_1e0,0.0,-1.0,0.0,this->period_ * 2.0);
    eqn_08.y = local_1e0.y;
    eqn_08.x = local_1e0.x;
    eqn_08.z = local_1e0.z;
    eqn_08.w = local_1e0.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_08);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_200,0.0,0.0,1.0,this->period_);
    eqn_09.y = local_200.y;
    eqn_09.x = local_200.x;
    eqn_09.z = local_200.z;
    eqn_09.w = local_200.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_09);
    pbVar1 = use_instance_local;
    vecng<4U,_double>::vecng(&local_220,0.0,0.0,-1.0,this->period_ * 2.0);
    eqn_10.y = local_220.y;
    eqn_10.x = local_220.x;
    eqn_10.z = local_220.z;
    eqn_10.w = local_220.w;
    VBW::ConvexCell::clip_by_plane((ConvexCell *)pbVar1,eqn_10);
    bVar2 = VBW::ConvexCell::empty((ConvexCell *)use_instance_local);
    pbVar1 = use_instance_local;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"!C.empty()",&local_241);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&TXmin,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,(allocator *)((long)&TXmax + 3));
      geo_assertion_failed((string *)local_240,(string *)&TXmin,0x7bc1);
    }
    TYmin = 0;
    TYmax = 0;
    TZmin = 0;
    TZmax = 0;
    local_280 = 0;
    local_284 = 0;
    vecng<4U,_double>::vecng(&local_2a8,1.0,0.0,0.0,0.0);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,&local_2a8);
    pbVar1 = use_instance_local;
    if (bVar2) {
      TYmin = -1;
    }
    vecng<4U,_double>::vecng(&local_2c8,-1.0,0.0,0.0,this->period_);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,&local_2c8);
    pbVar1 = use_instance_local;
    if (bVar2) {
      TYmax = 1;
    }
    vecng<4U,_double>::vecng(&local_2e8,0.0,1.0,0.0,0.0);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,&local_2e8);
    pbVar1 = use_instance_local;
    if (bVar2) {
      TZmin = -1;
    }
    vecng<4U,_double>::vecng(&local_308,0.0,-1.0,0.0,this->period_);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,&local_308);
    pbVar1 = use_instance_local;
    if (bVar2) {
      TZmax = 1;
    }
    vecng<4U,_double>::vecng(&local_328,0.0,0.0,1.0,0.0);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,&local_328);
    pbVar1 = use_instance_local;
    if (bVar2) {
      local_280 = -1;
    }
    vecng<4U,_double>::vecng((vecng<4U,_double> *)&TY,0.0,0.0,-1.0,this->period_);
    bVar2 = VBW::ConvexCell::cell_has_conflict((ConvexCell *)pbVar1,(vec4 *)&TY);
    if (bVar2) {
      local_284 = 1;
    }
    for (TZ = TYmin; TZ <= TYmax; TZ = TZ + 1) {
      for (iStack_350 = TZmin; iStack_350 <= TZmax; iStack_350 = iStack_350 + 1) {
        for (local_354 = local_280; pbVar1 = cell_is_on_boundary_local, local_354 <= local_284;
            local_354 = local_354 + 1) {
          iVar4 = Periodic::T_to_instance(-TZ,-iStack_350,-local_354);
          pbVar1[iVar4] = true;
        }
      }
    }
  }
  else {
    for (local_356 = VBW::ConvexCell::first_triangle((ConvexCell *)use_instance_local);
        local_356 != 0x3fff;
        local_356 = VBW::ConvexCell::next_triangle((ConvexCell *)use_instance_local,local_356)) {
      bVar2 = false;
      for (dU = 0; (uint)dU < 3; dU = dU + 1) {
        iVar3 = VBW::ConvexCell::triangle_v_local_index
                          ((ConvexCell *)use_instance_local,local_356,dU);
        if (iVar3 < local_9c) {
          (&lv)[(ulong)(uint)dU * 3] = 0;
          VXLAT[(ulong)(uint)dU - 1][2] = 0;
          VXLAT[(uint)dU][0] = 0;
        }
        else {
          (&lv)[(ulong)(uint)dU * 3] =
               get_periodic_vertex_instances_to_create::T[iVar3 - local_9c][0];
          VXLAT[(ulong)(uint)dU - 1][2] =
               get_periodic_vertex_instances_to_create::T[iVar3 - local_9c][1];
          VXLAT[(uint)dU][0] = get_periodic_vertex_instances_to_create::T[iVar3 - local_9c][2];
          bVar2 = true;
        }
      }
      if (bVar2) {
        *cell_is_outside_cube_local = true;
        for (dW = 0; dW < 2; dW = dW + 1) {
          for (Tx = 0; Tx < 2; Tx = Tx + 1) {
            for (Ty = 0; pbVar1 = cell_is_on_boundary_local, Ty < 2; Ty = Ty + 1) {
              iVar4 = Periodic::T_to_instance
                                (dW * lv + Tx * VXLAT[0][1] + Ty * VXLAT[1][1],
                                 dW * iStack_384 + Tx * VXLAT[0][2] + Ty * VXLAT[1][2],
                                 dW * VXLAT[0][0] + Tx * VXLAT[1][0] + Ty * VXLAT[2][0]);
              pbVar1[iVar4] = true;
            }
          }
        }
      }
    }
  }
  local_3b0 = 0;
  for (local_3b4 = 1; local_3b4 < 0x1b; local_3b4 = local_3b4 + 1) {
    local_3b0 = ((cell_is_on_boundary_local[local_3b4] & 1U) != 0) + local_3b0;
  }
  return local_3b0;
}

Assistant:

index_t PeriodicDelaunay3d::get_periodic_vertex_instances_to_create(
	index_t v,
	ConvexCell& C,
	bool use_instance[27],
	bool& cell_is_on_boundary,
	bool& cell_is_outside_cube,
	IncidentTetrahedra& W
    ) {	
	// Integer translations associated with the six plane equations
	// Note: indexing matches code below (order of the clipping
	// operations).
	static int T[6][3]= {
	    { 1, 0, 0},
	    {-1, 0, 0},
	    { 0, 1, 0},
	    { 0,-1, 0},
	    { 0, 0, 1},
	    { 0, 0,-1}
	};

	copy_Laguerre_cell_from_Delaunay(v, C, W);
	geo_assert(!C.empty());
	    
	// Determine the periodic instances of the vertex to be created
	// ************************************************************
	//   - Find all the intersected boundary faces
	//   - The instances to create correspond to all the possible
	//     sums of translation vectors associated with the
	//     intersected boundary faces
	
	FOR(i,27) {
	    use_instance[i] = false;
	}
	use_instance[0] = true;

	index_t cube_offset = C.nb_v();
	C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  0.0));
	C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  period_));
	C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  0.0));
	C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  period_));	
	C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  0.0));
	C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  period_));

	cell_is_outside_cube = false;
	cell_is_on_boundary = false;
	
	if(C.empty()) {
	    // Special case: cell is completely outside the cube.	    
	    cell_is_outside_cube = true;
	    copy_Laguerre_cell_from_Delaunay(v, C, W);
	    // Clip the cell with the 3x3x3 (rubic's) cube that
	    // surrounds the cube. Not only this avoids generating
	    // some unnecessary virtual vertices, but also, without
	    // it, it would generate neighborhoods with virtual vertices
	    // coordinates that differ by more than twice the period.
	    C.clip_by_plane(vec4( 1.0, 0.0, 0.0,  period_));
	    C.clip_by_plane(vec4(-1.0, 0.0, 0.0,  2.0*period_));
	    C.clip_by_plane(vec4( 0.0, 1.0, 0.0,  period_));
	    C.clip_by_plane(vec4( 0.0,-1.0, 0.0,  2.0*period_));	
	    C.clip_by_plane(vec4( 0.0, 0.0, 1.0,  period_));
	    C.clip_by_plane(vec4( 0.0, 0.0,-1.0,  2.0*period_));

	    // Normally we cannot have an empty cell, empty cells were
	    // detected before.
	    geo_assert(!C.empty());
	    
	    // Now detect the bounds of the sub-(rubic's) cube overlapped
	    // by the cell.
	    int TXmin = 0, TXmax = 0,
		TYmin = 0, TYmax = 0,
		TZmin = 0, TZmax = 0;
	    if(C.cell_has_conflict(vec4( 1.0, 0.0, 0.0,  0.0))) {
		TXmin = -1;
	    }
	    if(C.cell_has_conflict(vec4(-1.0, 0.0, 0.0,  period_))) {
		TXmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 1.0, 0.0,  0.0))) {
		TYmin = -1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0,-1.0, 0.0,  period_))) {
		TYmax = 1;
	    }
	    if(C.cell_has_conflict(vec4( 0.0, 0.0, 1.0,  0.0))) {
		TZmin = -1;
	    } 
	    if(C.cell_has_conflict(vec4( 0.0, 0.0,-1.0,  period_))) {
		TZmax = 1;
	    } 
	    for(int TX = TXmin; TX <= TXmax; ++TX) {
		for(int TY = TYmin; TY <= TYmax; ++TY) {
		    for(int TZ = TZmin; TZ <= TZmax; ++TZ) {
			use_instance[T_to_instance(-TX,-TY,-TZ)] = true;
		    }
		}
	    }
	} else {
	    // Back to the normal case, C contains the Laguerre cell clipped
	    // by the cube.
	    //   - Find all the intersected boundary faces
	    //   - The instances to create correspond to all the possible
	    //     sums of translation vectors associated with the
	    //     intersected boundary faces
	    
	    // Traverse all the Voronoi vertices of the face
	    for(
		VBW::ushort t = C.first_triangle();
		t!=VBW::END_OF_LIST; t=C.next_triangle(t)
	    ) {
		// The three (integer) translations associated with the
		// three faces on which the Voronoi vertex resides.
		int VXLAT[3][3];
		bool vertex_on_boundary = false;
		for(index_t lv=0; lv<3; ++lv) {
		    index_t pp = C.triangle_v_local_index(t,VBW::index_t(lv));
		    if(pp < cube_offset) {
			// Not a boundary face -> translation is zero.
			VXLAT[lv][0] = 0;
			VXLAT[lv][1] = 0;
			VXLAT[lv][2] = 0;
		    } else {
			// Boundary face -> there is a translation
			VXLAT[lv][0] = T[pp - cube_offset][0];
			VXLAT[lv][1] = T[pp - cube_offset][1];
			VXLAT[lv][2] = T[pp - cube_offset][2];
			vertex_on_boundary = true;
		    }
		}
		// If the vertex is on the boundary, mark all the instances
		// obtained by applying any combination of the (up to 3)
		// translations associated with the (up to 3)
		// boundary facets on which the vertex resides.
		if(vertex_on_boundary) {
		    cell_is_on_boundary = true;
		    for(int dU=0; dU<2; ++dU) {
			for(int dV=0; dV<2; ++dV) {
			    for(int dW=0; dW<2; ++dW) {
				
				int Tx = dU*VXLAT[0][0] + dV*VXLAT[1][0] +
				    dW*VXLAT[2][0];
				
				int Ty = dU*VXLAT[0][1] + dV*VXLAT[1][1] +
				    dW*VXLAT[2][1];
				
				int Tz = dU*VXLAT[0][2] + dV*VXLAT[1][2] +
				    dW*VXLAT[2][2];
				
				use_instance[T_to_instance(Tx,Ty,Tz)] = true;
			    }
			}
		    }
		}
	    }
	}
	index_t result = 0;
	for(index_t i=1; i<27; ++i) {
	    result += (use_instance[i] ? 1 : 0);
	}
	return result;
    }